

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_example.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::ApiExample::DealableQuotes
          (ApiExample *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *liquidity_providers)

{
  long lVar1;
  string *psVar2;
  undefined8 *puVar3;
  Tenor *pTVar4;
  BulkSubscriber *pBVar5;
  string lp;
  allocator<char> local_17a;
  allocator<char> local_179;
  undefined8 local_178;
  undefined8 local_170;
  ApiExample *local_168;
  string local_160 [32];
  pointer local_140;
  pointer local_138;
  string local_130 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string local_e0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  MandatoryFieldsSubjectCreator local_90 [64];
  string local_50 [32];
  
  local_140 = (liquidity_providers->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_168 = this;
  for (local_138 = (liquidity_providers->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; local_138 != local_140;
      local_138 = local_138 + 1) {
    std::__cxx11::string::string(local_130,(string *)local_138);
    pBVar5 = (local_168->subscriber_)._M_t.
             super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
    lVar1 = *(long *)pBVar5;
    pBVar5 = pBVar5 + *(long *)(lVar1 + -0x30);
    local_178 = (**(code **)(lVar1 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_170 = bidfx_public_api::price::subject::SubjectFactory::FX::Quote();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Spot();
    psVar2 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::LiquidityProvider(local_e0)
    ;
    std::__cxx11::string::string<std::allocator<char>>(local_50,"EURUSD",&local_179);
    psVar2 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::CurrencyPair(psVar2);
    std::__cxx11::string::string<std::allocator<char>>(local_160,"EUR",&local_17a);
    bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Currency(psVar2);
    puVar3 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Quantity(1000000.11);
    (**(code **)*puVar3)(&local_a8,puVar3);
    (**(code **)(*(long *)pBVar5 + 8))(pBVar5,&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_50);
    price::subject::SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
              (local_90);
    pBVar5 = (local_168->subscriber_)._M_t.
             super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
    lVar1 = *(long *)pBVar5;
    pBVar5 = pBVar5 + *(long *)(lVar1 + -0x30);
    local_178 = (**(code **)(lVar1 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_170 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Forward();
    psVar2 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                       (local_50);
    std::__cxx11::string::string<std::allocator<char>>(local_160,"EURUSD",&local_179);
    psVar2 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar2);
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"EUR",&local_17a);
    bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar2);
    pTVar4 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                                (1000000.0);
    puVar3 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar4);
    (**(code **)*puVar3)(&local_c0,puVar3);
    (**(code **)(*(long *)pBVar5 + 8))(pBVar5,&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_160);
    price::subject::SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
              (local_90);
    pBVar5 = (local_168->subscriber_)._M_t.
             super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
    lVar1 = *(long *)pBVar5;
    pBVar5 = pBVar5 + *(long *)(lVar1 + -0x30);
    local_178 = (**(code **)(lVar1 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_170 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Swap();
    psVar2 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::LiquidityProvider(local_50)
    ;
    std::__cxx11::string::string<std::allocator<char>>(local_160,"CHFJPY",&local_179);
    psVar2 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::CurrencyPair(psVar2);
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"CHF",&local_17a);
    bidfx_public_api::price::subject::SubjectFactory::FX::Swap::Currency(psVar2);
    pTVar4 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearQuantity
                                (15000000.0);
    bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearTenor(pTVar4);
    pTVar4 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarQuantity
                                (15000000.0);
    puVar3 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarTenor(pTVar4);
    (**(code **)*puVar3)(&local_f8,puVar3);
    (**(code **)(*(long *)pBVar5 + 8))(pBVar5,&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_160);
    price::subject::SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
              (local_90);
    pBVar5 = (local_168->subscriber_)._M_t.
             super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
    lVar1 = *(long *)pBVar5;
    pBVar5 = pBVar5 + *(long *)(lVar1 + -0x30);
    local_178 = (**(code **)(lVar1 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_170 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Nds();
    psVar2 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::LiquidityProvider(local_50)
    ;
    std::__cxx11::string::string<std::allocator<char>>(local_160,"USDCNY",&local_179);
    psVar2 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::CurrencyPair(psVar2);
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"USD",&local_17a);
    bidfx_public_api::price::subject::SubjectFactory::FX::Swap::Currency(psVar2);
    pTVar4 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearQuantity
                                (10000000.0);
    bidfx_public_api::price::subject::SubjectFactory::FX::Swap::NearTenor(pTVar4);
    pTVar4 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarQuantity
                                (8500000.0);
    puVar3 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Swap::FarTenor(pTVar4);
    (**(code **)*puVar3)(&local_110,puVar3);
    (**(code **)(*(long *)pBVar5 + 8))(pBVar5,&local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_160);
    price::subject::SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
              (local_90);
    std::__cxx11::string::~string(local_130);
  }
  return;
}

Assistant:

void ApiExample::DealableQuotes(std::vector<std::string> liquidity_providers)
{
    for (std::string lp : liquidity_providers)
    {
        subscriber_->Subscribe(subscriber_->Subjects().Fx().Quote().Spot()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1000000.11)
                .CreateSubject());

        subscriber_->Subscribe(subscriber_->Subjects().Fx().Stream().Forward()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1000000)
                .Tenor(Tenor::IN_1_MONTH)
                .CreateSubject());

        subscriber_->Subscribe(subscriber_->Subjects().Fx().Stream().Swap()
                .LiquidityProvider(lp)
                .CurrencyPair("CHFJPY")
                .Currency("CHF")
                .NearQuantity(15000000)
                .NearTenor(Tenor::IN_3_MONTHS)
                .FarQuantity(15000000)
                .FarTenor(Tenor::IN_1_YEAR)
                .CreateSubject());

        subscriber_->Subscribe(subscriber_->Subjects().Fx().Stream().Nds()
                .LiquidityProvider(lp)
                .CurrencyPair("USDCNY")
                .Currency("USD")
                .NearQuantity(10000000)
                .NearTenor(Tenor::IN_1_YEAR)
                .FarQuantity(8500000)
                .FarTenor(Tenor::IN_3_YEARS)
                .CreateSubject());
    }
}